

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2predicates.cc
# Opt level: O0

Excluded s2pred::TriageVoronoiSiteExclusion<long_double>
                   (Vector3<long_double> *a,Vector3<long_double> *b,Vector3<long_double> *x0,
                   Vector3<long_double> *x1,longdouble r2)

{
  ostream *poVar1;
  D *b_00;
  D *b_01;
  D *b_02;
  D *b_03;
  BasicVector<Vector3,_long_double,_3UL> *pBVar2;
  longdouble in_ST0;
  longdouble lVar3;
  longdouble lVar4;
  longdouble lVar5;
  longdouble lVar6;
  longdouble lVar7;
  longdouble lVar8;
  longdouble in_ST1;
  longdouble lVar9;
  longdouble lVar10;
  longdouble lVar11;
  longdouble lVar12;
  longdouble lVar13;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  double __x;
  __type_conflict _Var14;
  double __x_00;
  double dVar15;
  double __x_01;
  double __x_02;
  int local_5f8;
  int local_5f4;
  S2LogMessage local_490;
  S2LogMessageVoidify local_479;
  int local_478;
  int local_474;
  int cb;
  int ca;
  undefined1 auStack_468 [8];
  longdouble r90;
  longdouble cos_d_error;
  longdouble cos_d;
  longdouble result_error;
  longdouble result;
  longdouble sin_d_error;
  longdouble sin_d;
  longdouble aXb1;
  BasicVector<Vector3,_long_double,_3UL> local_3b8 [48];
  undefined1 local_388 [8];
  Vector3<long_double> aXb;
  longdouble lhs3_error;
  longdouble abs_lhs3;
  longdouble lhs3;
  longdouble rb_error;
  longdouble rb;
  longdouble min_rb2;
  longdouble rb2_error;
  longdouble rb2;
  longdouble bDn_error;
  longdouble bDn2;
  D local_288;
  undefined1 auStack_258 [8];
  longdouble bDn;
  longdouble bx2;
  longdouble ra_error;
  longdouble ra;
  longdouble min_ra2;
  longdouble ra2_error;
  longdouble ra2;
  longdouble aDn_error;
  longdouble aDn2;
  D local_198;
  undefined1 auStack_168 [8];
  longdouble aDn;
  longdouble ax2;
  longdouble n2sin2_r;
  longdouble sin2_r;
  longdouble cos_r;
  longdouble Dn_error;
  longdouble n1;
  longdouble n2;
  BasicVector<Vector3,_long_double,_3UL> local_b8 [48];
  BasicVector<Vector3,_long_double,_3UL> local_88 [8];
  Vector3<long_double> n;
  longdouble T_ERR;
  longdouble r2_local;
  Vector3<long_double> *x1_local;
  Vector3<long_double> *x0_local;
  Vector3<long_double> *b_local;
  Vector3<long_double> *a_local;
  
  pBVar2 = local_b8;
  lVar3 = in_ST5;
  unique0x100004bd = (longdouble)5.421011e-20;
  util::math::internal_vector::BasicVector<Vector3,_long_double,_3UL>::operator-
            ((D *)pBVar2,(BasicVector<Vector3,_long_double,_3UL> *)x0,x1);
  util::math::internal_vector::BasicVector<Vector3,_long_double,_3UL>::operator+
            ((D *)((long)&n2 + 8),(BasicVector<Vector3,_long_double,_3UL> *)x0,x1);
  Vector3<long_double>::CrossProd
            ((Vector3<long_double> *)local_88,(Vector3<long_double> *)pBVar2,(D *)((long)&n2 + 8));
  util::math::internal_vector::BasicVector<Vector3,_long_double,_3UL>::Norm2
            ((longdouble *)local_88,pBVar2);
  unique0x100004b3 = in_ST0;
  std::sqrt(__x);
  unique0x100004a9 = in_ST1;
  _Var14 = std::sqrt<int>(3);
  lVar9 = stack0xfffffffffffffef8 * (longdouble)(_Var14 + _Var14 + 3.5);
  _Var14 = std::sqrt<int>(3);
  register0x00001110 =
       (longdouble)5.421011e-20 * ((longdouble)(_Var14 * 32.0 * 1.1102230246251565e-16) + lVar9);
  register0x00001110 = (longdouble)-0.5 * r2 + (longdouble)1;
  register0x00001110 = r2 * ((longdouble)-0.25 * r2 + (longdouble)1);
  register0x00001110 = register0x00001110 * stack0xffffffffffffff08;
  lVar11 = lVar3;
  lVar10 = lVar3;
  lVar4 = lVar3;
  GetClosestVertex<long_double>
            ((Vector3<long_double> *)((long)&aDn2 + 8),a,x0,x1,(longdouble *)((long)&aDn + 8));
  util::math::internal_vector::BasicVector<Vector3,_long_double,_3UL>::operator-
            (&local_198,(BasicVector<Vector3,_long_double,_3UL> *)a,
             (Vector3<long_double> *)((long)&aDn2 + 8));
  util::math::internal_vector::BasicVector<Vector3,_long_double,_3UL>::DotProd
            ((longdouble *)&local_198,local_88,b_00);
  lVar9 = stack0xfffffffffffffee8;
  register0x00001100 = in_ST2 * in_ST2;
  _auStack_168 = in_ST2;
  dVar15 = std::sqrt(__x_00);
  register0x00001110 = lVar9 * in_ST3;
  register0x00001110 = stack0xfffffffffffffeb8 - stack0xfffffffffffffe28;
  lVar9 = (longdouble)8.883953e-16 * stack0xfffffffffffffe28;
  dVar15 = std::fabs(dVar15);
  register0x00001110 =
       (longdouble)3.2526065e-19 * stack0xfffffffffffffeb8 +
       stack0xfffffffffffffe18 * (in_ST4 + in_ST4 + stack0xfffffffffffffe18) + lVar9;
  register0x00001110 = stack0xfffffffffffffe08 - register0x00001110;
  if ((longdouble)0 <= register0x00001110) {
    lVar13 = lVar4;
    lVar5 = lVar4;
    dVar15 = std::sqrt(dVar15);
    lVar9 = (longdouble)0.5 * stack0xfffffffffffffdf8;
    unique0x10000495 = in_ST5;
    std::sqrt(dVar15);
    register0x00001110 = (longdouble)8.131516e-20 * in_ST5 + lVar9 / lVar3;
    lVar3 = lVar5;
    lVar6 = lVar5;
    lVar7 = lVar5;
    GetClosestVertex<long_double>
              ((Vector3<long_double> *)((long)&bDn2 + 8),b,x0,x1,(longdouble *)((long)&bDn + 8));
    util::math::internal_vector::BasicVector<Vector3,_long_double,_3UL>::operator-
              (&local_288,(BasicVector<Vector3,_long_double,_3UL> *)b,
               (Vector3<long_double> *)((long)&bDn2 + 8));
    util::math::internal_vector::BasicVector<Vector3,_long_double,_3UL>::DotProd
              ((longdouble *)&local_288,local_88,b_01);
    lVar9 = stack0xfffffffffffffee8;
    _auStack_258 = lVar11;
    dVar15 = std::sqrt(__x_01);
    lVar9 = lVar9 * lVar10;
    lVar10 = stack0xfffffffffffffeb8 - lVar11 * lVar11;
    dVar15 = std::fabs(dVar15);
    lVar11 = (longdouble)3.2526065e-19 * stack0xfffffffffffffeb8 +
             lVar9 * (lVar4 + lVar4 + lVar9) + (longdouble)8.883953e-16 * lVar11 * lVar11;
    if ((longdouble)0 <= lVar10 - lVar11) {
      lVar10 = lVar7;
      dVar15 = std::sqrt(dVar15);
      lVar4 = lVar10;
      dVar15 = std::sqrt(dVar15);
      lVar12 = (lVar13 - stack0xfffffffffffffdd8) * stack0xfffffffffffffed8;
      lVar8 = lVar4;
      std::fabs(dVar15);
      register0x00001110 =
           (longdouble)1.6263033e-19 * lVar3 +
           ((longdouble)8.131516e-20 * lVar13 + ((longdouble)0.5 * lVar11) / lVar5 +
           stack0xfffffffffffffdc8) * stack0xfffffffffffffed8;
      pBVar2 = local_3b8;
      lVar11 = lVar8;
      util::math::internal_vector::BasicVector<Vector3,_long_double,_3UL>::operator-
                ((D *)pBVar2,(BasicVector<Vector3,_long_double,_3UL> *)a,b);
      util::math::internal_vector::BasicVector<Vector3,_long_double,_3UL>::operator+
                ((D *)((long)&aXb1 + 8),(BasicVector<Vector3,_long_double,_3UL> *)a,b);
      Vector3<long_double>::CrossProd
                ((Vector3<long_double> *)local_388,(Vector3<long_double> *)pBVar2,
                 (D *)((long)&aXb1 + 8));
      util::math::internal_vector::BasicVector<Vector3,_long_double,_3UL>::Norm
                ((FloatType *)local_388,pBVar2);
      unique0x10000481 = lVar6;
      util::math::internal_vector::BasicVector<Vector3,_long_double,_3UL>::DotProd
                ((longdouble *)local_388,local_88,b_02);
      register0x00001110 = (longdouble)0.5 * lVar7;
      _Var14 = std::sqrt<int>(3);
      lVar13 = stack0xfffffffffffffef8 *
               stack0xfffffffffffffc08 *
               ((longdouble)4.440892e-16 +
               (longdouble)5.421011e-20 * (longdouble)(_Var14 + _Var14 + 2.5));
      _Var14 = std::sqrt<int>(3);
      register0x00001110 =
           lVar13 + (stack0xfffffffffffffef8 + stack0xfffffffffffffc08) *
                    (longdouble)(_Var14 * 16.0 * 1.1102230246251565e-16) * (longdouble)5.421011e-20;
      register0x00001110 = lVar3 - stack0xfffffffffffffbf8;
      register0x00001110 = register0x00001110 + stack0xfffffffffffffca8;
      if (-register0x00001110 <= register0x00001110) {
        util::math::internal_vector::BasicVector<Vector3,_long_double,_3UL>::DotProd
                  ((longdouble *)a,(BasicVector<Vector3,_long_double,_3UL> *)b,b_03);
        register0x00001110 = stack0xffffffffffffff08 * lVar10 - _auStack_258 * _auStack_168;
        dVar15 = std::fabs(__x_02);
        lVar10 = stack0xfffffffffffffe18 + (longdouble)8.884495e-16 * lVar4;
        dVar15 = std::fabs(dVar15);
        std::fabs(dVar15);
        register0x00001110 =
             (longdouble)8.886121e-16 * stack0xffffffffffffff08 +
             lVar10 * lVar8 + lVar9 * (stack0xfffffffffffffe18 + lVar11);
        if (-register0x00001110 < stack0xfffffffffffffbb8) {
          if (register0x00001110 <= stack0xfffffffffffffbb8) {
            if (-stack0xfffffffffffffbe8 <= stack0xfffffffffffffbf8) {
              if (stack0xfffffffffffffbf8 <= stack0xfffffffffffffbe8) {
                return UNCERTAIN;
              }
            }
            else {
              _cb = S1ChordAngle::Right();
              dVar15 = S1ChordAngle::length2((S1ChordAngle *)&cb);
              _auStack_468 = (longdouble)dVar15;
              if (-stack0xfffffffffffffca8 <= lVar12) {
                local_5f4 = TriageCompareCosDistance<long_double>(a,x0,_auStack_468);
              }
              else {
                local_5f4 = -1;
              }
              local_474 = local_5f4;
              if (lVar12 <= stack0xfffffffffffffca8) {
                local_5f8 = TriageCompareCosDistance<long_double>(b,x1,_auStack_468);
              }
              else {
                local_5f8 = -1;
              }
              local_478 = local_5f8;
              if ((local_474 < 0) && (local_5f8 < 0)) {
                return NEITHER;
              }
              if ((local_474 < 1) && (local_5f8 < 1)) {
                return UNCERTAIN;
              }
              if (lVar3 <= stack0xfffffffffffffca8) {
                return UNCERTAIN;
              }
            }
            if (stack0xfffffffffffffbc8 < stack0xfffffffffffffbd8) {
              if (lVar3 <= stack0xfffffffffffffca8) {
                S2FatalLogMessage::S2FatalLogMessage
                          ((S2FatalLogMessage *)&local_490,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2predicates.cc"
                           ,0x4f4,kFatal,(ostream *)&std::cerr);
                poVar1 = S2LogMessage::stream(&local_490);
                poVar1 = std::operator<<(poVar1,"Check failed: (abs_lhs3) > (lhs3_error) ");
                S2LogMessageVoidify::operator&(&local_479,poVar1);
                S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_490);
              }
              a_local._4_4_ = (Excluded)(lVar12 <= (longdouble)0);
            }
            else {
              a_local._4_4_ = UNCERTAIN;
            }
          }
          else {
            a_local._4_4_ = UNCERTAIN;
          }
        }
        else {
          a_local._4_4_ = NEITHER;
        }
      }
      else {
        a_local._4_4_ = NEITHER;
      }
    }
    else {
      a_local._4_4_ = UNCERTAIN;
    }
  }
  else {
    a_local._4_4_ = UNCERTAIN;
  }
  return a_local._4_4_;
}

Assistant:

Excluded TriageVoronoiSiteExclusion(const Vector3<T>& a, const Vector3<T>& b,
                                    const Vector3<T>& x0, const Vector3<T>& x1,
                                    T r2) {
  constexpr T T_ERR = rounding_epsilon<T>();

  // Define the "coverage disc" of a site S to be the disc centered at S with
  // radius r (i.e., squared chord angle length r2).  Similarly, define the
  // "coverage interval" of S along an edge X to be the intersection of X with
  // the coverage disc of S.  The coverage interval can be represented as the
  // point at the center of the interval and an angle that measures the
  // semi-width or "radius" of the interval.
  //
  // To test whether site A excludes site B along the input edge X, we test
  // whether the coverage interval of A contains the coverage interval of B.
  // Let "ra" and "rb" be the radii (semi-widths) of the two intervals, and
  // let "d" be the angle between their center points.  Then "a" properly
  // contains "b" if (ra - rb > d), and "b" contains "a" if (rb - ra > d).
  // Note that only one of these conditions can be true.  Therefore we can
  // determine whether one site excludes the other by checking whether
  //
  // (1)   |rb - ra| > d
  //
  // and use the sign of (rb - ra) to determine which site is excluded.
  //
  // The actual code is based on the following.  Let A1 and B1 be the unit
  // vectors A and B scaled by cos(r) (these points are inside the sphere).
  // The planes perpendicular to OA1 and OA2 cut off two discs of radius r
  // around A and B.  Now consider the two lines (inside the sphere) where
  // these planes intersect the plane containing the input edge X, and let A2
  // and B2 be the points on these lines that are closest to A and B.  The
  // coverage intervals of A and B can be represented as an interval along
  // each of these lines, centered at A2 and B2.  Let P1 and P2 be the
  // endpoints of the coverage interval for A, and let Q1 and Q2 be the
  // endpoints of the coverage interval for B.  We can view each coverage
  // interval as either a chord through the sphere's interior, or as a segment
  // of the original edge X (by projecting the chord onto the sphere's
  // surface).
  //
  // To check whether B's interval is contained by A's interval, we test
  // whether both endpoints of B's interval (Q1 and Q2) are contained by A's
  // interval.  E.g., we could test whether Qi.DotProd(A2) > A2.Norm2().
  //
  // However rather than constructing the actual points A1, A2, and so on, it
  // turns out to be more efficient to compute the sines and cosines
  // ("components") of the various angles and then use trigonometric
  // identities.  Predicate (1) can be expressed as
  //
  //      |sin(rb - ra)| > sin(d)
  //
  // provided that |d| <= Pi/2 (which must be checked), and then expanded to
  //
  // (2)  |sin(rb) cos(ra) - sin(ra) cos(rb)| > sin(d) .
  //
  // The components of the various angles can be expressed using dot and cross
  // products based on the construction above:
  //
  //   sin(ra) = sqrt(sin^2(r) |a|^2 |n|^2 - |a.n|^2) / |aXn|
  //   cos(ra) = cos(r) |a| |n| / |aXn|
  //   sin(rb) = sqrt(sin^2(r) |b|^2 |n|^2 - |b.n|^2) / |bXn|
  //   cos(rb) = cos(r) |b| |n| / |bXn|
  //   sin(d)  = (aXb).n |n| / (|aXn| |bXn|)
  //   cos(d)  = (aXn).(bXn) / (|aXn| |bXn|)
  //
  // Also, the squared chord length r2 is equal to 4 * sin^2(r / 2), which
  // yields the following relationships:
  //
  //   sin(r)  = sqrt(r2 (1 - r2 / 4))
  //   cos(r)  = 1 - r2 / 2
  //
  // We then scale both sides of (2) by |aXn| |bXn| / |n| (in order to
  // minimize the number of calculations and to avoid divisions), which gives:
  //
  //    cos(r) ||a| sqrt(sin^2(r) |b|^2 |n|^2 - |b.n|^2) -
  //            |b| sqrt(sin^2(r) |a|^2 |n|^2 - |a.n|^2)| > (aXb).n
  //
  // Furthermore we can substitute |a| = |b| = 1 (as long as this is taken
  // into account in the error bounds), yielding
  //
  // (3)   cos(r) |sqrt(sin^2(r) |n|^2 - |b.n|^2) -
  //               sqrt(sin^2(r) |n|^2 - |a.n|^2)| > (aXb).n
  //
  // The code below is more complicated than this because many expressions
  // have been modified for better numerical stability.  For example, dot
  // products between unit vectors are computed using (x - y).DotProd(x + y),
  // and the dot product between a point P and the normal N of an edge X is
  // measured using (P - Xi).DotProd(N) where Xi is the endpoint of X that is
  // closer to P.

  Vector3<T> n = (x0 - x1).CrossProd(x0 + x1);  // 2 * x0.CrossProd(x1)
  T n2 = n.Norm2();
  T n1 = sqrt(n2);
  // This factor is used in the error terms of dot products with "n" below.
  T Dn_error = ((3.5 + 2 * sqrt(3)) * n1 + 32 * sqrt(3) * DBL_ERR) * T_ERR;

  T cos_r = 1 - 0.5 * r2;
  T sin2_r = r2 * (1 - 0.25 * r2);
  T n2sin2_r = n2 * sin2_r;

  // "ra" and "rb" denote sin(ra) and sin(rb) after the scaling above.
  T ax2, aDn = (a - GetClosestVertex(a, x0, x1, &ax2)).DotProd(n);
  T aDn2 = aDn * aDn;
  T aDn_error = Dn_error * sqrt(ax2);
  T ra2 = n2sin2_r - aDn2;
  T ra2_error = (8 * DBL_ERR + 4 * T_ERR) * aDn2 +
      (2 * fabs(aDn) + aDn_error) * aDn_error + 6 * T_ERR * n2sin2_r;
  // This is the minimum possible value of ra2, which is used to bound the
  // derivative of sqrt(ra2) in computing ra_error below.
  T min_ra2 = ra2 - ra2_error;
  if (min_ra2 < 0) return Excluded::UNCERTAIN;
  T ra = sqrt(ra2);
  // Includes the ra2 subtraction error above.
  T ra_error = 1.5 * T_ERR * ra + 0.5 * ra2_error / sqrt(min_ra2);

  T bx2, bDn = (b - GetClosestVertex(b, x0, x1, &bx2)).DotProd(n);
  T bDn2 = bDn * bDn;
  T bDn_error = Dn_error * sqrt(bx2);
  T rb2 = n2sin2_r - bDn2;
  T rb2_error = (8 * DBL_ERR + 4 * T_ERR) * bDn2 +
      (2 * fabs(bDn) + bDn_error) * bDn_error + 6 * T_ERR * n2sin2_r;
  T min_rb2 = rb2 - rb2_error;
  if (min_rb2 < 0) return Excluded::UNCERTAIN;
  T rb = sqrt(rb2);
  // Includes the rb2 subtraction error above.
  T rb_error = 1.5 * T_ERR * rb + 0.5 * rb2_error / sqrt(min_rb2);

  // The sign of LHS(3) determines which site may be excluded by the other.
  T lhs3 = cos_r * (rb - ra);
  T abs_lhs3 = fabs(lhs3);
  T lhs3_error = cos_r * (ra_error + rb_error) + 3 * T_ERR * abs_lhs3;

  // Now we evaluate the RHS of (3), which is proportional to sin(d).
  Vector3<T> aXb = (a - b).CrossProd(a + b);  // 2 * a.CrossProd(b)
  T aXb1 = aXb.Norm();
  T sin_d = 0.5 * aXb.DotProd(n);
  T sin_d_error = (4 * DBL_ERR + (2.5 + 2 * sqrt(3)) * T_ERR) * aXb1 * n1 +
      16 * sqrt(3) * DBL_ERR * T_ERR * (aXb1 + n1);

  // If LHS(3) is definitely less than RHS(3), neither site excludes the other.
  T result = abs_lhs3 - sin_d;
  T result_error = lhs3_error + sin_d_error;
  if (result < -result_error) return Excluded::NEITHER;

  // Otherwise, before proceeding further we need to check that |d| <= Pi/2.
  // In fact, |d| < Pi/2 is enough because of the requirement that r < Pi/2.
  // The following expression represents cos(d) after scaling; it is
  // equivalent to (aXn).(bXn) but has about 30% less error.
  T cos_d = a.DotProd(b) * n2 - aDn * bDn;
  T cos_d_error =
      ((8 * DBL_ERR + 5 * T_ERR) * fabs(aDn) + aDn_error) * fabs(bDn) +
      (fabs(aDn) + aDn_error) * bDn_error + (8 * DBL_ERR + 8 * T_ERR) * n2;
  if (cos_d <= -cos_d_error) return Excluded::NEITHER;

  // Potential optimization: if the sign of cos(d) is uncertain, then instead
  // we could check whether cos(d) >= cos(r).  Unfortunately this is fairly
  // expensive since it requires computing denominator |aXn||bXn| of cos(d)
  // and the associated error bounds.  In any case this case is relatively
  // rare so it seems better to punt.
  if (cos_d < cos_d_error) return Excluded::UNCERTAIN;

  // Normally we have d > 0 because the sites are sorted so that A is closer
  // to X0 and B is closer to X1.  However if the edge X is longer than Pi/2,
  // and the sites A and B are beyond its endpoints, then AB can wrap around
  // the sphere in the opposite direction from X.  In this situation d < 0 but
  // each site is closest to one endpoint of X, so neither excludes the other.
  //
  // It turns out that this can happen only when the site that is further away
  // from edge X is less than 90 degrees away from whichever endpoint of X it
  // is closer to.  It is provable that if this distance is less than 90
  // degrees, then it is also less than r2, and therefore the Voronoi regions
  // of both sites intersect the edge.
  if (sin_d < -sin_d_error) {
    T r90 = S1ChordAngle::Right().length2();
    // "ca" is negative if Voronoi region A definitely intersects edge X.
    int ca = (lhs3 < -lhs3_error) ? -1 : TriageCompareCosDistance(a, x0, r90);
    int cb = (lhs3 > lhs3_error) ? -1 : TriageCompareCosDistance(b, x1, r90);
    if (ca < 0 && cb < 0) return Excluded::NEITHER;
    if (ca <= 0 && cb <= 0) return Excluded::UNCERTAIN;
    if (abs_lhs3 <= lhs3_error) return Excluded::UNCERTAIN;
  } else if (sin_d <= sin_d_error) {
    return Excluded::UNCERTAIN;
  }
  // Now we can finish checking the results of predicate (3).
  if (result <= result_error) return Excluded::UNCERTAIN;
  S2_DCHECK_GT(abs_lhs3, lhs3_error);
  return (lhs3 > 0) ? Excluded::FIRST : Excluded::SECOND;
}